

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItemPrivate::QGraphicsItemPrivate(QGraphicsItemPrivate *this)

{
  QTransform *in_RDI;
  InputMethodHint in_stack_ffffffffffffffec;
  
  in_RDI->m_matrix[0][0] = (qreal)&PTR__QGraphicsItemPrivate_00d322b8;
  QList<QGraphicsItemPrivate::ExtraStruct>::QList
            ((QList<QGraphicsItemPrivate::ExtraStruct> *)0x970aae);
  QRectF::QRectF((QRectF *)(in_RDI->m_matrix[1] + 1));
  QRectF::QRectF((QRectF *)(in_RDI->m_matrix[2] + 2));
  QHash<QWidget_*,_QRect>::QHash((QHash<QWidget_*,_QRect> *)(in_RDI[1].m_matrix[0] + 2));
  QPointF::QPointF((QPointF *)(in_RDI[1].m_matrix + 1));
  in_RDI[1].m_matrix[1][2] = 0.0;
  in_RDI[1].m_matrix[2][0] = 1.0;
  in_RDI[1].m_matrix[2][1] = 0.0;
  in_RDI[1].m_matrix[2][2] = 0.0;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x970b25);
  in_RDI[2].m_matrix[0][2] = 0.0;
  in_RDI[2].m_matrix[1][0] = 0.0;
  QTransform::QTransform(in_RDI);
  *(undefined4 *)(in_RDI[3].m_matrix[1] + 1) = 0xffffffff;
  *(undefined4 *)((long)in_RDI[3].m_matrix[1] + 0xc) = 0xffffffff;
  *(undefined4 *)(in_RDI[3].m_matrix[1] + 2) = 0xffffffff;
  in_RDI[3].m_matrix[2][0] = 0.0;
  QList<QGraphicsItem_**>::QList((QList<QGraphicsItem_**> *)0x970b86);
  in_RDI[4].m_matrix[0][0] = 0.0;
  in_RDI[4].m_matrix[0][1] = 0.0;
  QFlags<Qt::InputMethodHint>::QFlags
            ((QFlags<Qt::InputMethodHint> *)in_RDI,in_stack_ffffffffffffffec);
  *(undefined4 *)((long)in_RDI[4].m_matrix[0] + 0x14) = 0;
  QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::QMap
            ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)0x970bca);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffffffe0 | 0x1f);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffffffdf | 0x20);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffffffbf);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffffff7f | 0x80);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfffffffffffffeff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfffffffffffffdff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfffffffffffffbff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfffffffffffff7ff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffffefff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffffdfff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffffbfff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffff7fff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffffe0ffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffff9fffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffff7fffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfffffffffeffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfffffffffdffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfffffffffbffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfffffffff7ffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffefffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffdfffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffffbfffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffffffff7fffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfff00000ffffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffefffffffffffff);
  in_RDI[4].m_matrix[1][1] =
       (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffdfffffffffffff | 0x20000000000000);
  in_RDI[4].m_matrix[1][1] =
       (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xffbfffffffffffff | 0x40000000000000);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xff7fffffffffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfeffffffffffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfdffffffffffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xfbffffffffffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xf7ffffffffffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xefffffffffffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xdfffffffffffffff);
  in_RDI[4].m_matrix[1][1] = (qreal)((ulong)in_RDI[4].m_matrix[1][1] & 0xbfffffffffffffff);
  in_RDI[4].m_matrix[1][1] = ABS(in_RDI[4].m_matrix[1][1]);
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xfffffffe;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xfffffffd | 2;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xfffffffb;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xfffffff7;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xffffffef;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xffffffdf | 0x20;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xffffffbf;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xffffff7f;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xfffffeff;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xfffffdff;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xfffffbff;
  *(uint *)(in_RDI[4].m_matrix[1] + 2) = *(uint *)(in_RDI[4].m_matrix[1] + 2) & 0xfffff7ff | 0x800;
  *(undefined4 *)((long)in_RDI[4].m_matrix[1] + 0x14) = 0xffffffff;
  in_RDI[4].m_matrix[2][0] = 0.0;
  return;
}

Assistant:

QGraphicsItemPrivate::QGraphicsItemPrivate()
    : z(0),
      opacity(1.),
      scene(nullptr),
      parent(nullptr),
      transformData(nullptr),
      graphicsEffect(nullptr),
      index(-1),
      siblingIndex(-1),
      itemDepth(-1),
      focusProxy(nullptr),
      subFocusItem(nullptr),
      focusScopeItem(nullptr),
      imHints(Qt::ImhNone),
      panelModality(QGraphicsItem::NonModal),
      acceptedMouseButtons(0x1f),
      visible(true),
      explicitlyHidden(false),
      enabled(true),
      explicitlyDisabled(false),
      selected(false),
      acceptsHover(false),
      acceptDrops(false),
      isMemberOfGroup(false),
      handlesChildEvents(false),
      itemDiscovered(false),
      hasCursor(false),
      ancestorFlags(0),
      cacheMode(0),
      hasBoundingRegionGranularity(false),
      isWidget(false),
      dirty(false),
      dirtyChildren(false),
      localCollisionHack(false),
      inSetPosHelper(false),
      needSortChildren(false),
      allChildrenDirty(false),
      fullUpdatePending(false),
      flags(0),
      paintedViewBoundingRectsNeedRepaint(false),
      dirtySceneTransform(true),
      geometryChanged(true),
      inDestructor(false),
      isObject(false),
      ignoreVisible(false),
      ignoreOpacity(false),
      acceptTouchEvents(false),
      acceptedTouchBeginEvent(false),
      filtersDescendantEvents(false),
      sceneTransformTranslateOnly(false),
      notifyBoundingRectChanged(false),
      notifyInvalidated(false),
      mouseSetsFocus(true),
      explicitActivate(false),
      wantsActive(false),
      holesInSiblingIndex(false),
      sequentialOrdering(true),
      updateDueToGraphicsEffect(false),
      scenePosDescendants(false),
      pendingPolish(false),
      mayHaveChildWithGraphicsEffect(false),
      sendParentChangeNotification(false),
      dirtyChildrenBoundingRect(true),
      globalStackingOrder(-1),
      q_ptr(nullptr)
{
}